

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

int __thiscall Fl_Text_Display::handle(Fl_Text_Display *this,int event)

{
  Fl_Text_Buffer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Fl_Window *pFVar7;
  Fl *pFVar8;
  size_t sVar9;
  _func_int *UNRECOVERED_JUMPTABLE;
  int posType;
  uint *__writefds;
  Fl_Cursor FVar10;
  undefined8 uVar11;
  Fl_Text_Buffer *pFVar12;
  fd_set *in_R8;
  timeval *in_R9;
  int end;
  int start;
  int local_30;
  int local_2c;
  
  if (this->mBuffer == (Fl_Text_Buffer *)0x0) {
    return 0;
  }
  iVar2 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,
                           (this->text_area).h);
  iVar4 = Fl::e_y;
  iVar3 = Fl::e_x;
  if (iVar2 != 0 || this->dragging != 0) {
    if (0x12 < event - 1U) {
      return 0;
    }
    __writefds = (uint *)((long)&switchD_001d5ad8::switchdataD_0021d0e8 +
                         (long)(int)(&switchD_001d5ad8::switchdataD_0021d0e8)[event - 1U]);
    switch(event) {
    case 1:
      iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
      if ((iVar3 != 0) &&
         (pFVar7 = Fl_Widget::window((Fl_Widget *)this), pFVar7 != (Fl_Window *)0x0)) {
        uVar5 = (this->text_area).h;
        __writefds = (uint *)(ulong)uVar5;
        iVar3 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,uVar5);
        pFVar7 = Fl_Widget::window((Fl_Widget *)this);
        FVar10 = FL_CURSOR_INSERT;
        if (iVar3 == 0) {
          FVar10 = FL_CURSOR_DEFAULT;
        }
        Fl_Window::cursor(pFVar7,FVar10);
      }
      if ((Fl_Text_Display *)Fl::focus_ != this) {
        Fl::focus((Fl_Widget *)this);
        (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
      }
      iVar3 = Fl_Group::handle(&this->super_Fl_Group,1);
      if (iVar3 != 0) {
        return 1;
      }
      if ((Fl::e_state._2_1_ & 1) == 0) {
        this->dragging = 1;
        iVar3 = xy_to_position(this,Fl::e_x,Fl::e_y,(int)__writefds);
        this->dragPos = iVar3;
        iVar2 = Fl_Text_Selection::includes(&this->mBuffer->mPrimary,iVar3);
        iVar4 = Fl::e_clicks;
        if (iVar2 == 0) {
          this->dragType = Fl::e_clicks;
          if (iVar4 == 1) {
            pFVar12 = this->mBuffer;
            iVar4 = Fl_Text_Buffer::word_start(pFVar12,iVar3);
            uVar5 = Fl_Text_Buffer::word_end(this->mBuffer,iVar3);
            Fl_Text_Buffer::select
                      (pFVar12,iVar4,(fd_set *)(ulong)uVar5,(fd_set *)__writefds,in_R8,in_R9);
            iVar4 = Fl_Text_Buffer::word_start(this->mBuffer,iVar3);
            this->dragPos = iVar4;
          }
          else if (iVar4 == 0) {
            Fl_Text_Buffer::unselect(this->mBuffer);
          }
          if ((this->mBuffer->mPrimary).mSelected == true) {
            iVar3 = (this->mBuffer->mPrimary).mEnd;
          }
          insert_position(this,iVar3);
          this->display_insert_position_hint = 1;
          (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                    (this,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
                     (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
                     (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,
                     (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
          return 1;
        }
        this->dragType = -1;
        return 1;
      }
      UNRECOVERED_JUMPTABLE = (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3];
      uVar11 = 5;
      break;
    case 2:
      if ((((Fl::e_is_click != 0) && (Fl::e_clicks == 0)) &&
          (iVar3 = Fl_Text_Selection::includes(&this->mBuffer->mPrimary,this->dragPos), iVar3 != 0))
         && ((Fl::e_state._2_1_ & 1) == 0)) {
        Fl_Text_Buffer::unselect(this->mBuffer);
        insert_position(this,this->dragPos);
        return 1;
      }
      if ((Fl::e_clicks == 2) && (Fl::e_keysym == 0xfee9)) {
        pFVar12 = this->mBuffer;
        iVar3 = Fl_Text_Buffer::line_start(pFVar12,this->dragPos);
        this_00 = this->mBuffer;
        iVar4 = Fl_Text_Buffer::line_end(this_00,this->dragPos);
        uVar5 = Fl_Text_Buffer::next_char(this_00,iVar4);
        Fl_Text_Buffer::select
                  (pFVar12,iVar3,(fd_set *)(ulong)uVar5,(fd_set *)__writefds,in_R8,in_R9);
        iVar3 = line_start(this,this->dragPos);
        this->dragPos = iVar3;
      }
      else {
        this->dragging = 0;
        if (scroll_direction != 0) {
          Fl::remove_timeout(scroll_timer_cb,this);
          scroll_direction = 0;
        }
      }
      this->dragType = 0;
      goto LAB_001d6094;
    case 3:
    case 0xb:
      goto switchD_001d5ad8_caseD_3;
    case 4:
    case 0xf:
      goto switchD_001d5ad8_caseD_4;
    case 5:
      if (this->dragType == -2) {
        return 1;
      }
      if (this->dragType != -1) {
        iVar2 = this->mCursorPos;
        iVar6 = (this->text_area).y;
        if (Fl::e_y < iVar6) {
          scroll_x = Fl::e_x;
          scroll_amount = (Fl::e_y - iVar6) / 5 + -1;
          if (scroll_direction == 0) {
            Fl::add_timeout(0.01,scroll_timer_cb,this);
          }
          scroll_direction = 3;
        }
        else {
          iVar6 = iVar6 + (this->text_area).h;
          if (Fl::e_y < iVar6) {
            iVar6 = (this->text_area).x;
            if (Fl::e_x < iVar6) {
              scroll_y = Fl::e_y;
              scroll_amount = (Fl::e_x - iVar6) / 2 + -1;
              if (scroll_direction == 0) {
                Fl::add_timeout(0.01,scroll_timer_cb,this);
              }
              scroll_direction = 2;
            }
            else {
              iVar6 = iVar6 + (this->text_area).w;
              posType = Fl::e_x - iVar6;
              if (Fl::e_x < iVar6) {
                if (scroll_direction != 0) {
                  Fl::remove_timeout(scroll_timer_cb,this);
                  scroll_direction = 0;
                }
                iVar3 = xy_to_position(this,iVar3,iVar4,posType);
                iVar2 = Fl_Text_Buffer::next_char(this->mBuffer,iVar3);
              }
              else {
                scroll_y = Fl::e_y;
                scroll_amount = posType / 2 + 1;
                if (scroll_direction == 0) {
                  Fl::add_timeout(0.01,scroll_timer_cb,this);
                }
                scroll_direction = 1;
              }
            }
          }
          else {
            scroll_x = Fl::e_x;
            scroll_amount = (Fl::e_y - iVar6) / 5 + 1;
            if (scroll_direction == 0) {
              Fl::add_timeout(0.01,scroll_timer_cb,this);
            }
            scroll_direction = 4;
          }
        }
        fl_text_drag_me(iVar2,this);
        return 1;
      }
      if (Fl::e_is_click != 0) {
        return 1;
      }
      bVar1 = Fl::option(OPTION_DND_TEXT);
      if (!bVar1) {
        return 1;
      }
      pFVar8 = (Fl *)Fl_Text_Buffer::selection_text(this->mBuffer);
      Fl::dnd();
      goto LAB_001d5e6a;
    case 6:
      goto switchD_001d5ad8_caseD_6;
    case 7:
      goto switchD_001d5ad8_caseD_7;
    case 8:
      goto switchD_001d5ad8_caseD_8;
    default:
      goto switchD_001d5ad8_caseD_9;
    case 0xc:
      if (this->shortcut_ == 0) {
        iVar3 = Fl_Widget::test_shortcut((Fl_Widget *)this);
      }
      else {
        iVar3 = Fl::test_shortcut(this->shortcut_);
      }
      if (iVar3 == 0) {
        return 0;
      }
      bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
      if (!bVar1) {
        return 0;
      }
      iVar3 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
      if (iVar3 == 0) {
        return 0;
      }
      Fl::focus((Fl_Widget *)this);
      return 1;
    case 0x13:
      if (Fl::e_dy == 0) {
        this = (Fl_Text_Display *)this->mHScrollBar;
      }
      else {
        this = (Fl_Text_Display *)this->mVScrollBar;
      }
      UNRECOVERED_JUMPTABLE = (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3];
      uVar11 = 0x13;
    }
    iVar3 = (*UNRECOVERED_JUMPTABLE)(this,uVar11);
    return iVar3;
  }
  __writefds = &switchD_001d5bea::switchdataD_0021d134;
  switch(event) {
  case 3:
  case 0xb:
switchD_001d5ad8_caseD_3:
    iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,
                             (this->text_area).h);
    pFVar7 = Fl_Widget::window((Fl_Widget *)this);
    if (iVar3 != 0) {
      FVar10 = FL_CURSOR_INSERT;
      goto LAB_001d5c5f;
    }
    break;
  case 4:
switchD_001d5ad8_caseD_4:
    iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar3 == 0) {
      return 0;
    }
    pFVar7 = Fl_Widget::window((Fl_Widget *)this);
    if (pFVar7 == (Fl_Window *)0x0) {
      return 0;
    }
    pFVar7 = Fl_Widget::window((Fl_Widget *)this);
    break;
  default:
    iVar3 = Fl_Group::handle(&this->super_Fl_Group,event);
    return iVar3;
  case 6:
    goto switchD_001d5ad8_caseD_6;
  case 7:
switchD_001d5ad8_caseD_7:
    iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
    if ((iVar3 != 0) && (pFVar7 = Fl_Widget::window((Fl_Widget *)this), pFVar7 != (Fl_Window *)0x0))
    {
      pFVar7 = Fl_Widget::window((Fl_Widget *)this);
      Fl_Window::cursor(pFVar7,FL_CURSOR_DEFAULT);
    }
    goto switchD_001d5ad8_caseD_6;
  case 8:
switchD_001d5ad8_caseD_8:
    if ((Fl::e_state._2_1_ & 4) != 0) {
      if (Fl::e_keysym == 0x61) {
        Fl_Text_Buffer::select
                  (this->mBuffer,0,(fd_set *)(ulong)(uint)this->mBuffer->mLength,
                   (fd_set *)__writefds,in_R8,in_R9);
LAB_001d6094:
        pFVar8 = (Fl *)Fl_Text_Buffer::selection_text(this->mBuffer);
        if (*pFVar8 != (Fl)0x0) {
          sVar9 = strlen((char *)pFVar8);
          Fl::copy(pFVar8,(EVP_PKEY_CTX *)(sVar9 & 0xffffffff),(EVP_PKEY_CTX *)0x0);
        }
        free(pFVar8);
        return 1;
      }
      if (Fl::e_keysym == 99) {
        if ((this->mBuffer->mPrimary).mSelected == false) {
          return 1;
        }
        pFVar8 = (Fl *)Fl_Text_Buffer::selection_text(this->mBuffer);
        if (*pFVar8 != (Fl)0x0) {
          sVar9 = strlen((char *)pFVar8);
          Fl::copy(pFVar8,(EVP_PKEY_CTX *)(sVar9 & 0xffffffff),(EVP_PKEY_CTX *)&DAT_00000001);
        }
LAB_001d5e6a:
        free(pFVar8);
        return 1;
      }
    }
    iVar3 = (*(this->mVScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget
              [3])(this->mVScrollBar,8);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = (*(this->mHScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget
              [3])(this->mHScrollBar,8);
    if (iVar3 != 0) {
      return 1;
    }
  case 9:
    goto switchD_001d5ad8_caseD_9;
  }
  FVar10 = FL_CURSOR_DEFAULT;
LAB_001d5c5f:
  Fl_Window::cursor(pFVar7,FVar10);
  return 1;
switchD_001d5ad8_caseD_9:
  return 0;
switchD_001d5ad8_caseD_6:
  pFVar12 = this->mBuffer;
  if ((pFVar12->mPrimary).mSelected != false) {
    iVar3 = Fl_Text_Buffer::selection_position(pFVar12,&local_2c,&local_30);
    if (iVar3 != 0) {
      redisplay_range(this,local_2c,local_30);
    }
    pFVar12 = this->mBuffer;
  }
  if ((pFVar12->mSecondary).mSelected != false) {
    iVar3 = Fl_Text_Buffer::secondary_selection_position(pFVar12,&local_2c,&local_30);
    if (iVar3 != 0) {
      redisplay_range(this,local_2c,local_30);
    }
    pFVar12 = this->mBuffer;
  }
  if ((pFVar12->mHighlight).mSelected != false) {
    iVar3 = Fl_Text_Buffer::highlight_position(pFVar12,&local_2c,&local_30);
    if (iVar3 != 0) {
      redisplay_range(this,local_2c,local_30);
      return 1;
    }
    return 1;
  }
  return 1;
}

Assistant:

int Fl_Text_Display::handle(int event) {
  if (!buffer()) return 0;
  // This isn't very elegant!
  if (!Fl::event_inside(text_area.x, text_area.y, text_area.w, text_area.h) &&
      !dragging && event != FL_LEAVE && event != FL_ENTER &&
      event != FL_MOVE && event != FL_FOCUS && event != FL_UNFOCUS &&
      event != FL_KEYBOARD && event != FL_KEYUP) {
    return Fl_Group::handle(event);
  }

  switch (event) {
    case FL_ENTER:
    case FL_MOVE:
      if (active_r()) {
        if (Fl::event_inside(text_area.x, text_area.y, text_area.w,
	                     text_area.h)) window()->cursor(FL_CURSOR_INSERT);
	else window()->cursor(FL_CURSOR_DEFAULT);
	return 1;
      } else {
        return 0;
      }

    case FL_LEAVE:
    case FL_HIDE:
      if (active_r() && window()) {
        window()->cursor(FL_CURSOR_DEFAULT);

	return 1;
      } else {
	return 0;
      }

    case FL_PUSH: {
      if (active_r() && window()) {
        if (Fl::event_inside(text_area.x, text_area.y, text_area.w,
                             text_area.h)) window()->cursor(FL_CURSOR_INSERT);
        else window()->cursor(FL_CURSOR_DEFAULT);
      }

      if (Fl::focus() != this) {
        Fl::focus(this);
        handle(FL_FOCUS);
      }
      if (Fl_Group::handle(event)) return 1;
      if (Fl::event_state()&FL_SHIFT) return handle(FL_DRAG);
      dragging = 1;
      int pos = xy_to_position(Fl::event_x(), Fl::event_y(), CURSOR_POS);
      dragPos = pos;
      if (buffer()->primary_selection()->includes(pos)) {
        dragType = DRAG_START_DND;
        return 1;
      }
      dragType = Fl::event_clicks();
      if (dragType == DRAG_CHAR) {
        buffer()->unselect();
//	Fl::copy("", 0, 0); /* removed for STR 2668 */
      }
      else if (dragType == DRAG_WORD) {
        buffer()->select(word_start(pos), word_end(pos));
	dragPos = word_start(pos);
	}

      if (buffer()->primary_selection()->selected())
        insert_position(buffer()->primary_selection()->end());
      else
        insert_position(pos);
      show_insert_position();
      return 1;
    }

    case FL_DRAG: {
      if (dragType==DRAG_NONE)
        return 1;
      if (dragType==DRAG_START_DND) {
        if (!Fl::event_is_click() && Fl::dnd_text_ops()) {
          const char* copy = buffer()->selection_text();
#ifdef __APPLE__
          Fl_X::dnd(1);
#else
          Fl::dnd();
#endif
          free((void*)copy);
        }
        return 1;
      }
      int X = Fl::event_x(), Y = Fl::event_y(), pos = insert_position();
      // if we leave the text_area, we start a timer event
      // that will take care of scrolling and selecting
      if (Y < text_area.y) {
        scroll_x = X;
        scroll_amount = (Y - text_area.y) / 5 - 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 3;
      } else if (Y >= text_area.y+text_area.h) {
        scroll_x = X;
        scroll_amount = (Y - text_area.y - text_area.h) / 5 + 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 4;
      } else if (X < text_area.x) {
        scroll_y = Y;
        scroll_amount = (X - text_area.x) / 2 - 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 2;
      } else if (X >= text_area.x+text_area.w) {
        scroll_y = Y;
        scroll_amount = (X - text_area.x - text_area.w) / 2 + 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 1;
      } else {
        if (scroll_direction) {
          Fl::remove_timeout(scroll_timer_cb, this);
          scroll_direction = 0;
        }
        pos = xy_to_position(X, Y, CURSOR_POS);
        pos = buffer()->next_char(pos);
      }
      fl_text_drag_me(pos, this);
      return 1;
    }

    case FL_RELEASE: {
      if (Fl::event_is_click() && (! Fl::event_clicks()) &&
	  buffer()->primary_selection()->includes(dragPos) && !(Fl::event_state()&FL_SHIFT) ) {
	buffer()->unselect(); // clicking in the selection: unselect and move cursor
	insert_position(dragPos);
	return 1;
      } else if (Fl::event_clicks() == DRAG_LINE && Fl::event_button() == FL_LEFT_MOUSE) {
        buffer()->select(buffer()->line_start(dragPos), buffer()->next_char(buffer()->line_end(dragPos)));
	dragPos = line_start(dragPos);
	dragType = DRAG_CHAR;
      } else {
	dragging = 0;
	if (scroll_direction) {
	  Fl::remove_timeout(scroll_timer_cb, this);
	  scroll_direction = 0;
	}

	// convert from WORD or LINE selection to CHAR
	/*if (insert_position() >= dragPos)
	  dragPos = buffer()->primary_selection()->start();
	else
	  dragPos = buffer()->primary_selection()->end();*/
	dragType = DRAG_CHAR;
      }

      const char* copy = buffer()->selection_text();
      if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
      free((void*)copy);
      return 1;
    }

    case FL_MOUSEWHEEL:
      if (Fl::event_dy()) return mVScrollBar->handle(event);
      else return mHScrollBar->handle(event);

    case FL_UNFOCUS:
      if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    case FL_FOCUS:
      if (buffer()->selected()) {
        int start, end;
        if (buffer()->selection_position(&start, &end))
          redisplay_range(start, end);
      }
      if (buffer()->secondary_selected()) {
        int start, end;
        if (buffer()->secondary_selection_position(&start, &end))
          redisplay_range(start, end);
      }
      if (buffer()->highlight()) {
        int start, end;
        if (buffer()->highlight_position(&start, &end))
          redisplay_range(start, end);
      }
      return 1;

    case FL_KEYBOARD:
      // Copy?
      if ((Fl::event_state()&(FL_CTRL|FL_COMMAND)) && Fl::event_key()=='c') {
        if (!buffer()->selected()) return 1;
        const char *copy = buffer()->selection_text();
        if (*copy) Fl::copy(copy, (int) strlen(copy), 1);
        free((void*)copy);
        return 1;
      }

      // Select all ?
      if ((Fl::event_state()&(FL_CTRL|FL_COMMAND)) && Fl::event_key()=='a') {
        buffer()->select(0,buffer()->length());
        const char *copy = buffer()->selection_text();
        if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
        free((void*)copy);
        return 1;
      }

      if (mVScrollBar->handle(event)) return 1;
      if (mHScrollBar->handle(event)) return 1;

      break;

    case FL_SHORTCUT:
      if (!(shortcut() ? Fl::test_shortcut(shortcut()) : test_shortcut()))
        return 0;
      if (Fl::visible_focus() && handle(FL_FOCUS)) {
        Fl::focus(this);
        return 1;
      }
      break;

  }

  return 0;
}